

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglGLES2SharingThreadedTests.cpp
# Opt level: O0

void __thiscall
deqp::egl::GLES2ThreadTest::DeleteTexture::DeleteTexture
          (DeleteTexture *this,SharedPtr<deqp::egl::GLES2ThreadTest::Texture> *texture,bool useSync,
          bool serverSync)

{
  SharedPtr<deqp::egl::GLES2ThreadTest::Object> local_40 [2];
  undefined1 local_1a;
  undefined1 local_19;
  bool serverSync_local;
  SharedPtr<deqp::egl::GLES2ThreadTest::Texture> *pSStack_18;
  bool useSync_local;
  SharedPtr<deqp::egl::GLES2ThreadTest::Texture> *texture_local;
  DeleteTexture *this_local;
  
  local_1a = serverSync;
  local_19 = useSync;
  pSStack_18 = texture;
  texture_local = (SharedPtr<deqp::egl::GLES2ThreadTest::Texture> *)this;
  Operation::Operation(&this->super_Operation,"DeleteTexture",useSync,serverSync);
  (this->super_Operation).super_Operation._vptr_Operation =
       (_func_int **)&PTR__DeleteTexture_03277638;
  de::SharedPtr<deqp::egl::GLES2ThreadTest::Texture>::SharedPtr(&this->m_texture,texture);
  de::SharedPtr<deqp::egl::GLES2ThreadTest::Object>::SharedPtr<deqp::egl::GLES2ThreadTest::Texture>
            (local_40,&this->m_texture);
  Operation::modifyGLObject(&this->super_Operation,local_40);
  de::SharedPtr<deqp::egl::GLES2ThreadTest::Object>::~SharedPtr(local_40);
  return;
}

Assistant:

DeleteTexture::DeleteTexture (SharedPtr<Texture> texture, bool useSync, bool serverSync)
	: Operation		("DeleteTexture", useSync, serverSync)
	, m_texture		(texture)
{
	modifyGLObject(SharedPtr<Object>(m_texture));
}